

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O0

String * __thiscall
cplus::lang::ByteArray::toBinString(String *__return_storage_ptr__,ByteArray *this)

{
  char *str;
  int local_24;
  int index;
  char *buffer;
  ByteArray *this_local;
  String *ret;
  
  str = (char *)operator_new__(this->size * 9 + 1);
  str[this->size * 9] = '\0';
  for (local_24 = 0; (ulong)(long)local_24 < this->size; local_24 = local_24 + 1) {
    binToString(this->buffer[local_24],str + local_24 * 9);
    str[local_24 * 9 + 8] = ' ';
  }
  String::String(__return_storage_ptr__,str);
  if (str != (char *)0x0) {
    operator_delete__(str);
  }
  return __return_storage_ptr__;
}

Assistant:

lang::String ByteArray::toBinString() const {
			auto *buffer = new char[size * 9 + 1];
			buffer[size * 9] = 0;
			for (int index = 0; index < size; index++) {
				binToString(this->buffer[index], buffer + index * 9);
				buffer[index * 9 + 8] = ' ';
			}
			auto ret = lang::String(buffer);
			delete[] buffer;
			return ret;
		}